

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O3

void __thiscall QAbstractSpinBox::mouseMoveEvent(QAbstractSpinBox *this,QMouseEvent *event)

{
  QAbstractSpinBoxPrivate *this_00;
  ulong uVar1;
  bool bVar2;
  long in_FS_OFFSET;
  double dVar3;
  undefined1 auVar4 [16];
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSpinBoxPrivate **)(this + 8);
  (this_00->keyboardModifiers).super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
  super_QFlagsStorage<Qt::KeyboardModifier>.i = *(Int *)(event + 0x20);
  auVar4 = QEventPoint::position();
  dVar3 = (double)((ulong)auVar4._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar4._0_8_;
  bVar2 = 2147483647.0 < dVar3;
  if (dVar3 <= -2147483648.0) {
    dVar3 = -2147483648.0;
  }
  local_28.xp.m_i =
       (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar3);
  dVar3 = (double)((ulong)auVar4._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar4._8_8_;
  bVar2 = 2147483647.0 < dVar3;
  if (dVar3 <= -2147483648.0) {
    dVar3 = -2147483648.0;
  }
  local_28.yp.m_i =
       (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar3);
  QAbstractSpinBoxPrivate::updateHoverControl(this_00,&local_28);
  if (((this_00->spinClickTimer).m_id == Invalid) || (this_00->buttonSymbols == NoButtons))
  goto LAB_0047a8c3;
  uVar1 = (**(code **)(*(long *)this + 0x1c8))(this);
  if (((uVar1 & 1) == 0) || (this_00->hoverControl != SC_ComboBoxFrame)) {
    if (((uVar1 & 2) != 0) && (this_00->hoverControl == SC_ComboBoxEditField)) {
      bVar2 = false;
      goto LAB_0047a8ae;
    }
    QAbstractSpinBoxPrivate::reset(this_00);
  }
  else {
    bVar2 = true;
LAB_0047a8ae:
    QAbstractSpinBoxPrivate::updateState(this_00,bVar2,false);
  }
  event[0xc] = (QMouseEvent)0x1;
LAB_0047a8c3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBox::mouseMoveEvent(QMouseEvent *event)
{
    Q_D(QAbstractSpinBox);

    d->keyboardModifiers = event->modifiers();
    d->updateHoverControl(event->position().toPoint());

    // If we have a timer ID, update the state
    if (d->spinClickTimer.isActive() && d->buttonSymbols != NoButtons) {
        const StepEnabled se = stepEnabled();
        if ((se & StepUpEnabled) && d->hoverControl == QStyle::SC_SpinBoxUp)
            d->updateState(true);
        else if ((se & StepDownEnabled) && d->hoverControl == QStyle::SC_SpinBoxDown)
            d->updateState(false);
        else
            d->reset();
        event->accept();
    }
}